

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  void *pvVar1;
  SerialArena *this_00;
  ulong uVar2;
  long *in_FS_OFFSET;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar3;
  
  uVar2 = *(ulong *)(this + 8);
  if ((uVar2 & 2) == 0) {
    pvVar1 = (void *)*in_FS_OFFSET;
    if (*(long *)((long)pvVar1 + 8) == *(long *)this) {
      this_00 = *(SerialArena **)((long)pvVar1 + 0x10);
    }
    else {
      this_00 = *(SerialArena **)(this + 0x18);
      if ((this_00 == (SerialArena *)0x0) || (this_00->owner_ != pvVar1)) goto LAB_00313ddd;
      uVar2 = *(ulong *)(this + 8);
    }
    pVar3 = SerialArena::AllocateAlignedWithCleanup
                      (this_00,n,(AllocationPolicy *)(uVar2 & 0xfffffffffffffff8));
    return pVar3;
  }
LAB_00313ddd:
  pVar3 = AllocateAlignedWithCleanupFallback(this,n,type);
  return pVar3;
}

Assistant:

std::pair<void*, SerialArena::CleanupNode*>
ThreadSafeArena::AllocateAlignedWithCleanup(size_t n,
                                            const std::type_info* type) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                            GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, alloc_policy_.get());
  } else {
    return AllocateAlignedWithCleanupFallback(n, type);
  }
}